

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

void __thiscall
kj::_::ExceptionOr<capnp::Response<capnproto_test::capnp::test::TestInterface::BarResults>_>::
~ExceptionOr(ExceptionOr<capnp::Response<capnproto_test::capnp::test::TestInterface::BarResults>_>
             *this)

{
  ExceptionOr<capnp::Response<capnproto_test::capnp::test::TestInterface::BarResults>_> *this_local;
  
  Maybe<capnp::Response<capnproto_test::capnp::test::TestInterface::BarResults>_>::~Maybe
            (&this->value);
  ExceptionOrValue::~ExceptionOrValue(&this->super_ExceptionOrValue);
  return;
}

Assistant:

ExceptionOr(T&& value): value(kj::mv(value)) {}